

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O1

BOOL Js::VariableWalkerBase::GetExceptionObject
               (int *index,DiagStackFrame *frame,ResolvedObject *pResolvedObject)

{
  Var pvVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  DebugContext *pDVar5;
  BOOL BVar6;
  
  if (pResolvedObject == (ResolvedObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0xad,"(pResolvedObject)","pResolvedObject");
    if (!bVar3) goto LAB_008bc4bf;
    *puVar4 = 0;
  }
  if (pResolvedObject->scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0xae,"(pResolvedObject->scriptContext)",
                                "pResolvedObject->scriptContext");
    if (!bVar3) goto LAB_008bc4bf;
    *puVar4 = 0;
  }
  if (frame == (DiagStackFrame *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0xaf,"(frame)","frame");
    if (!bVar3) goto LAB_008bc4bf;
    *puVar4 = 0;
  }
  if (*index < 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0xb0,"(index >= 0)","index >= 0");
    if (!bVar3) goto LAB_008bc4bf;
    *puVar4 = 0;
  }
  bVar3 = HasExceptionObject(frame);
  BVar6 = 0;
  if (bVar3) {
    if (*index == 0) {
      pResolvedObject->name = L"{exception}";
      pResolvedObject->typeId = TypeIds_Error;
      pResolvedObject->address = (IDiagObjectAddress *)0x0;
      pDVar5 = ScriptContext::GetDebugContext(pResolvedObject->scriptContext);
      pvVar1 = pDVar5->diagProbesContainer->jsExceptionObject;
      pResolvedObject->obj = pvVar1;
      BVar6 = 1;
      if (pvVar1 == (Var)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar4 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                    ,0xbd,"(false)","false");
        if (!bVar3) {
LAB_008bc4bf:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar4 = 0;
        pResolvedObject->obj =
             (((pResolvedObject->scriptContext->super_ScriptContextBase).javascriptLibrary)->
             super_JavascriptLibraryBase).undefinedValue.ptr;
      }
    }
    else {
      *index = *index + -1;
      BVar6 = 0;
    }
  }
  return BVar6;
}

Assistant:

BOOL VariableWalkerBase::GetExceptionObject(int &index, DiagStackFrame* frame, ResolvedObject* pResolvedObject)
    {
        Assert(pResolvedObject);
        Assert(pResolvedObject->scriptContext);
        Assert(frame);
        Assert(index >= 0);

        if (HasExceptionObject(frame))
        {
            if (index == 0)
            {
                pResolvedObject->name          = _u("{exception}");
                pResolvedObject->typeId        = TypeIds_Error;
                pResolvedObject->address       = nullptr;
                pResolvedObject->obj           = pResolvedObject->scriptContext->GetDebugContext()->GetProbeContainer()->GetExceptionObject();

                if (pResolvedObject->obj == nullptr)
                {
                    Assert(false);
                    pResolvedObject->obj = pResolvedObject->scriptContext->GetLibrary()->GetUndefined();
                }
                return TRUE;
            }

            // Adjust the index
            index -= 1;
        }

        return FALSE;
    }